

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<char,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<char,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
             *this,char **it)

{
  size_t sVar1;
  ptrdiff_t _Num;
  char *__dest;
  char *pcVar2;
  
  sVar1 = *(size_t *)(this + 0x10);
  __dest = *it;
  if (sVar1 != 0) {
    memmove(__dest,*(void **)(this + 8),sVar1);
    __dest = __dest + sVar1;
    *it = __dest;
  }
  sVar1 = *(size_t *)(this + 0x20);
  pcVar2 = __dest;
  if (sVar1 != 0) {
    pcVar2 = __dest + sVar1;
    memset(__dest,*(int *)(this + 0x18),sVar1);
  }
  *it = pcVar2;
  int_writer<char,fmt::v5::basic_format_specs<char>>::bin_writer<3>::operator()
            ((bin_writer<3> *)(this + 0x28),it);
  return;
}

Assistant:

void operator()(It &&it) const {
      if (prefix.size() != 0)
        it = internal::copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }